

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall google::protobuf::FileOptions::SharedDtor(FileOptions *this)

{
  internal::ArenaStringPtr::DestroyNoArena
            (&this->java_package_,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
  internal::ArenaStringPtr::DestroyNoArena
            (&this->java_outer_classname_,(string *)&internal::fixed_address_empty_string_abi_cxx11_
            );
  internal::ArenaStringPtr::DestroyNoArena
            (&this->go_package_,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
  internal::ArenaStringPtr::DestroyNoArena
            (&this->objc_class_prefix_,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
  internal::ArenaStringPtr::DestroyNoArena
            (&this->csharp_namespace_,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
  internal::ArenaStringPtr::DestroyNoArena
            (&this->swift_prefix_,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
  internal::ArenaStringPtr::DestroyNoArena
            (&this->php_class_prefix_,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
  return;
}

Assistant:

void FileOptions::SharedDtor() {
  java_package_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  java_outer_classname_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  go_package_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  objc_class_prefix_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  csharp_namespace_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  swift_prefix_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  php_class_prefix_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
}